

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_rmdir_ex(LIBSSH2_SFTP *sftp,char *path,uint path_len)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  size_t sVar5;
  char *errmsg;
  ulong buflen;
  uchar *s;
  size_t data_len;
  uchar *local_68;
  uchar *local_60;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_38 = path;
    start_time = time((time_t *)0x0);
    buflen = (ulong)(path_len + 0xd);
    local_48 = (ulong)path_len;
    local_40 = (ulong)(path_len + 9);
    local_50 = buflen;
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_58 = 0;
      local_68 = (uchar *)0x0;
      if (sftp->rmdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        local_60 = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        sftp->rmdir_packet = local_60;
        if (local_60 != (uchar *)0x0) {
          _libssh2_store_u32(&local_60,(uint32_t)local_40);
          *local_60 = '\x0f';
          uVar4 = sftp->request_id;
          sftp->request_id = uVar4 + 1;
          sftp->rmdir_request_id = uVar4;
          local_60 = local_60 + 1;
          _libssh2_store_u32(&local_60,uVar4);
          buflen = local_50;
          _libssh2_store_str(&local_60,local_38,local_48);
          sftp->rmdir_state = libssh2_NB_state_created;
          goto LAB_001286d6;
        }
        iVar3 = -6;
        errmsg = "Unable to allocate memory for FXP_RMDIR packet";
        local_60 = (uchar *)0x0;
        goto LAB_00128826;
      }
LAB_001286d6:
      if (sftp->rmdir_state == libssh2_NB_state_created) {
        bVar2 = false;
        sVar5 = _libssh2_channel_write(channel,0,sftp->rmdir_packet,buflen);
        if (sVar5 == 0xffffffffffffffdb) {
          iVar3 = -0x25;
        }
        else {
          iVar3 = (*pLVar1->free)(sftp->rmdir_packet,&pLVar1->abstract);
          sftp->rmdir_packet = (uchar *)0x0;
          if (sVar5 == buflen) {
            sftp->rmdir_state = libssh2_NB_state_sent;
            bVar2 = true;
          }
          else {
            sftp->rmdir_state = libssh2_NB_state_idle;
            iVar3 = _libssh2_error(pLVar1,-7,"Unable to send FXP_RMDIR command");
            bVar2 = false;
          }
        }
        if (bVar2) goto LAB_00128779;
      }
      else {
LAB_00128779:
        iVar3 = sftp_packet_require(sftp,'e',sftp->rmdir_request_id,&local_68,&local_58,9);
        if (iVar3 == 0) {
          sftp->rmdir_state = libssh2_NB_state_idle;
          uVar4 = _libssh2_ntohu32(local_68 + 5);
          (*pLVar1->free)(local_68,&pLVar1->abstract);
          if (uVar4 != 0) {
            sftp->last_errno = uVar4;
            iVar3 = -0x1f;
            errmsg = "SFTP Protocol Error";
            goto LAB_00128826;
          }
          iVar3 = 0;
        }
        else if (iVar3 != -0x25) {
          if (iVar3 == -0x26) {
            if (local_58 != 0) {
              (*pLVar1->free)(local_68,&pLVar1->abstract);
            }
            iVar3 = -0x1f;
            errmsg = "SFTP rmdir packet too short";
          }
          else {
            sftp->rmdir_state = libssh2_NB_state_idle;
            errmsg = "Error waiting for FXP STATUS";
          }
LAB_00128826:
          iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
        }
      }
      if (iVar3 != -0x25) {
        return iVar3;
      }
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,start_time);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_rmdir_ex(LIBSSH2_SFTP *sftp, const char *path,
                      unsigned int path_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_rmdir(sftp, path, path_len));
    return rc;
}